

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darData.c
# Opt level: O0

Vec_Int_t * Dar_LibReadNodes(void)

{
  Vec_Int_t *p;
  int local_14;
  int i;
  Vec_Int_t *vResult;
  
  p = Vec_IntAlloc(0x15704);
  for (local_14 = 0; local_14 < 0x15704; local_14 = local_14 + 1) {
    Vec_IntPush(p,s_Data1[local_14]);
  }
  return p;
}

Assistant:

Vec_Int_t * Dar_LibReadNodes()
{
    Vec_Int_t * vResult;
    int i;
    vResult = Vec_IntAlloc( s_nDataSize1 );
    for ( i = 0; i < s_nDataSize1; i++ )
        Vec_IntPush( vResult, s_Data1[i] );
    return vResult;
}